

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_StoPrint(Nf_Man_t *p,int fVerbose)

{
  Vec_Int_t *p_00;
  uint uVar1;
  int i;
  int i_00;
  
  i = 2;
  uVar1 = 0;
  while( true ) {
    if (p->vTt2Match->nSize <= i) break;
    p_00 = Vec_WecEntry(p->vTt2Match,i);
    for (i_00 = 1; i_00 < p_00->nSize; i_00 = i_00 + 2) {
      Vec_IntEntry(p_00,i_00 + -1);
      Vec_IntEntry(p_00,i_00);
      uVar1 = uVar1 + 1;
    }
    i = i + 1;
  }
  printf("Gates = %d.  Truths = %d.  Matches = %d.\n",(ulong)(uint)p->nCells,
         (ulong)(uint)p->vTtMem->nEntries,(ulong)uVar1);
  return;
}

Assistant:

void Nf_StoPrint( Nf_Man_t * p, int fVerbose )
{
    int t, i, GateId, Entry, Count = 0;
    for ( t = 2; t < Vec_WecSize(p->vTt2Match); t++ )
    {
        Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, t );
        Vec_IntForEachEntryDouble( vArr, GateId, Entry, i )
        {
            Count++;
            if ( !fVerbose )
                continue;
            //if ( t < 10 )
            //    Nf_StoPrintOne( p, Count, t, i/2, GateId, Pf_Int2Mat(Entry) );
        }
    }
    printf( "Gates = %d.  Truths = %d.  Matches = %d.\n", 
        p->nCells, Vec_MemEntryNum(p->vTtMem), Count );
}